

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

void flatcc_json_printer_indent(flatcc_json_printer_t *ctx)

{
  char *__s;
  ulong __n;
  size_t __n_00;
  char *pcVar1;
  
  __n = (ulong)ctx->indent * (long)ctx->level;
  pcVar1 = ctx->pflush;
  __s = ctx->p;
  if (pcVar1 < __s + __n) {
    if (pcVar1 <= __s) {
      (*ctx->flush)(ctx,0);
      pcVar1 = ctx->pflush;
      __s = ctx->p;
    }
    __n_00 = (long)pcVar1 - (long)__s;
    if (__n_00 < __n) {
      do {
        memset(__s,0x20,__n_00);
        ctx->p = ctx->p + __n_00;
        __n = __n - __n_00;
        (*ctx->flush)(ctx,0);
        __s = ctx->p;
        __n_00 = (long)ctx->pflush - (long)__s;
      } while (__n_00 < __n);
    }
  }
  memset(__s,0x20,__n);
  ctx->p = ctx->p + __n;
  return;
}

Assistant:

void flatcc_json_printer_indent(flatcc_json_printer_t *ctx)
{
    /*
     * This is only needed when indent is 0 but helps external users
     * to avoid flushing when indenting.
     */
    print_indent(ctx);
}